

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# user_geometry_device.cpp
# Opt level: O3

Vec3fa __thiscall
embree::renderPixelStandard
          (embree *this,TutorialData *data,float x,float y,ISPCCamera *camera,RayStats *stats)

{
  Vec3fa *pVVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Instance *pIVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar15;
  float fVar16;
  undefined1 auVar14 [16];
  float fVar17;
  Vec3fa Ng;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  Vec3fa VVar20;
  undefined1 local_138 [8];
  float fStack_130;
  float local_128;
  float fStack_124;
  float fStack_120;
  undefined4 uStack_11c;
  undefined8 local_118;
  float local_108;
  undefined8 local_104;
  uint local_f4;
  int iStack_f0;
  uint uStack_ec;
  undefined4 uStack_e8;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined1 local_b0 [16];
  undefined8 local_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  undefined4 uStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  undefined4 uStack_7c;
  undefined8 local_78;
  undefined4 local_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  
  local_128 = (camera->xfm).l.vy.field_0.field_0.x * y + (camera->xfm).l.vx.field_0.field_0.x * x +
              (camera->xfm).l.vz.field_0.field_0.x;
  auVar18._0_8_ = *(undefined8 *)((long)&(camera->xfm).l.vx.field_0 + 4);
  uVar2 = *(undefined8 *)((long)&(camera->xfm).l.vy.field_0 + 4);
  uVar3 = *(undefined8 *)((long)&(camera->xfm).l.vz.field_0 + 4);
  fVar10 = y * (float)uVar2 + (float)auVar18._0_8_ * x + (float)uVar3;
  fVar11 = y * (float)((ulong)uVar2 >> 0x20) + (float)((ulong)auVar18._0_8_ >> 0x20) * x +
           (float)((ulong)uVar3 >> 0x20);
  fVar8 = local_128 * local_128 + fVar10 * fVar10 + fVar11 * fVar11;
  auVar18 = rsqrtss(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8));
  fVar9 = auVar18._0_4_;
  fStack_120 = fVar9 * fVar9 * fVar8 * -0.5 * fVar9 + fVar9 * 1.5;
  local_128 = local_128 * fStack_120;
  fStack_124 = fStack_120 * fVar10;
  fStack_120 = fStack_120 * fVar11;
  fStack_130 = (float)(int)((ulong)*(undefined8 *)((long)&(camera->xfm).p.field_0 + 4) >> 0x20);
  local_138 = *(undefined8 *)&(camera->xfm).p.field_0;
  register0x0000128c = 0;
  uStack_11c = 0;
  local_118 = 0xffffffff7f800000;
  local_f4 = 0xffffffff;
  iStack_f0 = -1;
  uStack_ec = 0xffffffff;
  uStack_e8 = 0xffffffff;
  local_b8 = 0xa00000200000000;
  local_b0 = (undefined1  [16])0x0;
  local_a0 = 0;
  rtcTraversableIntersect1(data->g_traversable,local_138);
  stats->numRays = stats->numRays + 1;
  auVar18._0_8_ = 0;
  *(undefined1 (*) [16])this = (undefined1  [16])0x0;
  local_78._0_4_ = fVar10;
  if (iStack_f0 != -1) {
    uVar7 = (ulong)uStack_ec;
    fVar8 = (float)local_104;
    fVar10 = (float)((ulong)local_104 >> 0x20);
    if (uVar7 == 0xffffffff) {
      fVar11 = 0.0;
    }
    else {
      pIVar4 = data->g_instance[uVar7];
      fVar9 = fVar10 * (pIVar4->normal2world).vz.field_0.m128[3];
      fVar15 = fVar8 * (pIVar4->normal2world).vy.field_0.m128[2];
      fVar16 = fVar8 * (pIVar4->normal2world).vy.field_0.m128[3];
      fVar12 = local_108 * (pIVar4->normal2world).vx.field_0.m128[1];
      fVar13 = local_108 * (pIVar4->normal2world).vx.field_0.m128[2];
      fVar11 = local_108 * (pIVar4->normal2world).vx.field_0.m128[3];
      local_108 = local_108 * (pIVar4->normal2world).vx.field_0.m128[0] +
                  fVar8 * (pIVar4->normal2world).vy.field_0.m128[0] +
                  fVar10 * (pIVar4->normal2world).vz.field_0.m128[0];
      fVar8 = fVar12 + fVar8 * (pIVar4->normal2world).vy.field_0.m128[1] +
                       fVar10 * (pIVar4->normal2world).vz.field_0.m128[1];
      fVar10 = fVar13 + fVar15 + fVar10 * (pIVar4->normal2world).vz.field_0.m128[2];
      fVar11 = fVar11 + fVar16 + fVar9;
    }
    fVar9 = fVar8 * fVar8;
    fVar12 = fVar10 * fVar10;
    fVar11 = fVar11 * fVar11;
    fVar13 = fVar9 + local_108 * local_108 + fVar12;
    fVar15 = fVar9 + fVar9 + fVar11;
    fVar12 = fVar9 + fVar12 + fVar12;
    fVar11 = fVar9 + fVar11 + fVar11;
    auVar19._4_4_ = fVar15;
    auVar19._0_4_ = fVar13;
    auVar19._8_4_ = fVar12;
    auVar19._12_4_ = fVar11;
    auVar5._4_4_ = fVar15;
    auVar5._0_4_ = fVar13;
    auVar5._8_4_ = fVar12;
    auVar5._12_4_ = fVar11;
    auVar18 = rsqrtss(auVar19,auVar5);
    fVar11 = auVar18._0_4_;
    fVar9 = fVar11 * fVar11 * fVar13 * -0.5 * fVar11 + fVar11 * 1.5;
    fVar12 = fVar9 * local_108;
    fVar8 = fVar9 * fVar8;
    fVar9 = fVar9 * fVar10;
    if (0.0 <= fStack_120 * fVar9 + fStack_124 * fVar8 + local_128 * fVar12) {
      fVar12 = -fVar12;
      fVar8 = -fVar8;
      fVar9 = -fVar9;
    }
    if (uVar7 == 0xffffffff) {
      uVar6 = local_f4 + 0x10;
    }
    else {
      uVar6 = local_f4;
      if (uStack_ec != 0) {
        uVar6 = iStack_f0 + uStack_ec * 4;
      }
    }
    pVVar1 = data->colors + uVar6;
    fVar10 = (pVVar1->field_0).m128[0];
    fVar13 = (pVVar1->field_0).m128[1];
    fVar15 = (pVVar1->field_0).m128[2];
    fVar16 = (pVVar1->field_0).m128[3];
    auVar14._0_4_ = fVar10 * 0.5 + 0.0;
    auVar14._4_4_ = fVar13 * 0.5 + 0.0;
    auVar14._8_4_ = fVar15 * 0.5 + 0.0;
    auVar14._12_4_ = fVar16 * 0.5 + 0.0;
    *(undefined1 (*) [16])this = auVar14;
    auVar18 = rsqrtss(auVar14,0x40400000);
    fVar11 = auVar18._0_4_;
    fVar17 = fVar11 * 1.5 - fVar11 * fVar11 * fVar11 * 1.5;
    fVar11 = (float)local_118 * 0.999;
    local_98 = local_128 * fVar11 + (float)local_138._0_4_;
    fStack_94 = fStack_124 * fVar11 + (float)local_138._4_4_;
    fStack_90 = fStack_120 * fVar11 + fStack_130;
    local_88 = -(fVar17 * -1.0);
    fStack_84 = -(fVar17 * -1.0);
    fStack_80 = -(fVar17 * -1.0);
    uStack_8c = 0x3a83126f;
    uStack_7c = 0;
    local_78 = 0xffffffff7f800000;
    local_54 = 0xffffffff;
    uStack_50 = 0xffffffff;
    uStack_4c = 0xffffffff;
    uStack_48 = 0xffffffff;
    local_d8 = 0xa00000200000000;
    local_d0 = 0;
    uStack_c8 = 0;
    local_c0 = 0;
    rtcTraversableOccluded1(data->g_traversable,&local_98);
    stats->numRays = stats->numRays + 1;
    fVar11 = 0.0;
    auVar18._0_8_ = 0;
    if (0.0 <= (float)local_78) {
      fVar8 = -(fVar9 * fVar17 * -1.0 + fVar8 * fVar17 * -1.0 + fVar12 * fVar17 * -1.0);
      if (1.0 <= fVar8) {
        fVar8 = 1.0;
      }
      fVar9 = 0.0;
      if (0.0 <= fVar8) {
        fVar9 = fVar8;
      }
      local_78._0_4_ = fVar10 * fVar9;
      fVar11 = fVar13 * fVar9;
      auVar18._0_8_ = CONCAT44(auVar14._4_4_ + fVar11,auVar14._0_4_ + (float)local_78);
      auVar18._8_4_ = auVar14._8_4_ + fVar15 * fVar9;
      auVar18._12_4_ = auVar14._12_4_ + fVar16 * fVar9;
      *(undefined1 (*) [16])this = auVar18;
    }
  }
  VVar20.field_0.m128[3] = fVar11;
  VVar20.field_0.m128[2] = (float)local_78;
  VVar20.field_0._0_8_ = auVar18._0_8_;
  return (Vec3fa)VVar20.field_0;
}

Assistant:

Vec3fa renderPixelStandard(const TutorialData& data,
                          float x, float y, const ISPCCamera& camera,
                          RayStats& stats)
{
  /* initialize ray */
  Ray ray(Vec3fa(camera.xfm.p), 
                     Vec3fa(normalize(x*camera.xfm.l.vx + y*camera.xfm.l.vy + camera.xfm.l.vz)), 
                     0.0f, inf, 0.0f, -1,
                     RTC_INVALID_GEOMETRY_ID, RTC_INVALID_GEOMETRY_ID);

  /* intersect ray with scene */
  RTCIntersectArguments iargs;
  rtcInitIntersectArguments(&iargs);
#if USE_ARGUMENT_CALLBACKS
  iargs.filter = contextFilterFunction;
#endif
#if USE_ARGUMENT_CALLBACKS
  iargs.intersect = contextIntersectFunc;
#endif
  iargs.feature_mask = (RTCFeatureFlags) (FEATURE_MASK);
  
  rtcTraversableIntersect1(data.g_traversable,RTCRayHit_(ray),&iargs);
  RayStats_addRay(stats);

  /* shade pixels */
  Vec3fa color = Vec3fa(0.0f);
  if (ray.geomID != RTC_INVALID_GEOMETRY_ID)
  {
    /* calculate shading normal in world space */
    Vec3fa Ns = ray.Ng;

    if (ray.instID[0] != RTC_INVALID_GEOMETRY_ID) {
      Ns = xfmVector(data.g_instance[ray.instID[0]]->normal2world,Vec3fa(Ns));
    }
    Ns = face_forward(ray.dir,normalize(Ns));

    /* calculate diffuse color of geometries */
    Vec3fa diffuse = Vec3fa(0.0f);
    if      (ray.instID[0] ==  0) diffuse = data.colors[4*ray.instID[0]+ray.primID];
    else if (ray.instID[0] == -1) diffuse = data.colors[4*4+ray.primID];
    else                          diffuse = data.colors[4*ray.instID[0]+ray.geomID];
    color = color + diffuse*0.5f;

    /* initialize shadow ray */
    Vec3fa lightDir = normalize(Vec3fa(-1,-1,-1));
    Ray shadow(ray.org + 0.999f*ray.tfar*ray.dir, neg(lightDir), 0.001f, inf);

    /* trace shadow ray */
    RTCOccludedArguments sargs;
    rtcInitOccludedArguments(&sargs);
#if USE_ARGUMENT_CALLBACKS
    sargs.filter = contextFilterFunction;
#endif
#if USE_ARGUMENT_CALLBACKS
    sargs.occluded = contextOccludedFunc;
#endif
    sargs.feature_mask = (RTCFeatureFlags) (FEATURE_MASK);
    
    rtcTraversableOccluded1(data.g_traversable,RTCRay_(shadow),&sargs);
    RayStats_addShadowRay(stats);

    /* add light contribution */
    if (shadow.tfar >= 0.0f)
      color = color + diffuse*clamp(-dot(lightDir,Ns),0.0f,1.0f);
  }
  return color;
}